

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

QTemporaryFile * QTemporaryFile::createNativeFile(QFile *file)

{
  long lVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar7;
  QTemporaryFile *this;
  void *__buf;
  size_t __nbytes;
  long in_FS_OFFSET;
  char buffer [1024];
  size_t *psVar6;
  undefined4 extraout_var_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*((file->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d)->_vptr_QObjectData[7])
                    ();
  psVar6 = (size_t *)CONCAT44(extraout_var,iVar4);
  if (psVar6 != (size_t *)0x0) {
    __nbytes = *psVar6;
    uVar5 = (**(code **)(__nbytes + 0xb0))(psVar6,0xff00000);
    if ((uVar5 >> 0x15 & 1) == 0) {
      bVar3 = QIODevice::isOpen((QIODevice *)file);
      pp_Var2 = (file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject;
      if (bVar3) {
        iVar4 = (*pp_Var2[0xf])(file);
        uVar7 = CONCAT44(extraout_var_00,iVar4);
      }
      else {
        iVar4 = (*pp_Var2[0xd])(file,1);
        uVar7 = 0;
        this = (QTemporaryFile *)0x0;
        if ((char)iVar4 == '\0') goto LAB_0023e7a9;
      }
      this = (QTemporaryFile *)operator_new(0x10);
      QTemporaryFile(this);
      iVar4 = (*(this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject
                [0xd])(this,3);
      if ((char)iVar4 == '\0') {
        (*(this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject[4])
                  (this);
        this = (QTemporaryFile *)0x0;
      }
      else {
        (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x11])(file,0);
        memset(buffer,0xaa,0x400);
        while( true ) {
          __buf = (void *)QIODevice::read((QIODevice *)file,(int)buffer,(void *)0x400,__nbytes);
          if ((long)__buf < 1) break;
          QIODevice::write((QIODevice *)this,(int)buffer,__buf,__nbytes);
        }
        (*(this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject[0x11])
                  (this,0);
      }
      pp_Var2 = (file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject;
      if (bVar3) {
        (*pp_Var2[0x11])(file,uVar7);
      }
      else {
        (*pp_Var2[0xe])(file);
      }
      goto LAB_0023e7a9;
    }
  }
  this = (QTemporaryFile *)0x0;
LAB_0023e7a9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTemporaryFile *QTemporaryFile::createNativeFile(QFile &file)
{
    if (QAbstractFileEngine *engine = file.d_func()->engine()) {
        if (engine->fileFlags(QAbstractFileEngine::FlagsMask) & QAbstractFileEngine::LocalDiskFlag)
            return nullptr; // native already
        //cache
        bool wasOpen = file.isOpen();
        qint64 old_off = 0;
        if (wasOpen)
            old_off = file.pos();
        else if (!file.open(QIODevice::ReadOnly))
            return nullptr;
        //dump data
        QTemporaryFile *ret = new QTemporaryFile;
        if (ret->open()) {
            file.seek(0);
            char buffer[1024];
            while (true) {
                qint64 len = file.read(buffer, 1024);
                if (len < 1)
                    break;
                ret->write(buffer, len);
            }
            ret->seek(0);
        } else {
            delete ret;
            ret = nullptr;
        }
        //restore
        if (wasOpen)
            file.seek(old_off);
        else
            file.close();
        //done
        return ret;
    }
    return nullptr;
}